

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  TransformerLinLog *pTVar4;
  ImDrawVert *pIVar5;
  uint *puVar6;
  ImVec2 IVar7;
  uint uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ImPlotPoint IVar9;
  ImVec2 P21;
  ImVec2 P22;
  ImVec2 local_60;
  undefined1 local_58 [16];
  ImVec2 local_48;
  ImPlotPoint local_40;
  
  pTVar4 = this->Transformer;
  IVar9 = GetterXsYs<double>::operator()(this->Getter1,prim + 1);
  local_40.y = IVar9.y;
  local_40.x = IVar9.x;
  local_60 = TransformerLinLog::operator()(pTVar4,&local_40);
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_4_ = local_60.x;
  local_58._4_4_ = local_60.y;
  local_58._12_4_ = extraout_XMM0_Dd;
  pTVar4 = this->Transformer;
  IVar9 = GetterXsYs<double>::operator()(this->Getter2,prim + 1);
  local_40.y = IVar9.y;
  local_40.x = IVar9.x;
  local_48 = TransformerLinLog::operator()(pTVar4,&local_40);
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  uVar8 = -(uint)((float)local_58._4_4_ < local_48.y && fVar2 < fVar1 ||
                 fVar1 < fVar2 && local_48.y < (float)local_58._4_4_) & 1;
  IVar7 = Intersection(&this->P11,&local_60,&this->P12,&local_48);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar5 = DrawList->_VtxWritePtr;
  pIVar5->col = this->Col;
  pIVar5[1].pos = local_60;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar5 = DrawList->_VtxWritePtr;
  pIVar5[1].col = this->Col;
  pIVar5[2].pos = IVar7;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar5 = DrawList->_VtxWritePtr;
  pIVar5[2].col = this->Col;
  pIVar5[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar5 = DrawList->_VtxWritePtr;
  pIVar5[3].col = this->Col;
  pIVar5[4].pos = local_48;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar5 = DrawList->_VtxWritePtr;
  pIVar5[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar5 + 5;
  uVar3 = DrawList->_VtxCurrentIdx;
  puVar6 = DrawList->_IdxWritePtr;
  *puVar6 = uVar3;
  puVar6[1] = uVar3 + uVar8 + 1;
  puVar6[2] = DrawList->_VtxCurrentIdx + 3;
  puVar6[3] = DrawList->_VtxCurrentIdx + 1;
  puVar6[4] = (uVar8 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar6[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar6 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  this->P11 = local_60;
  this->P12 = local_48;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }